

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_idate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  tm *ptVar6;
  int iVar7;
  ulong iValue;
  time_t t;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_result_int(pCtx,-1);
    return 0;
  }
  pcVar5 = jx9_value_to_string(*apArg,&nLen);
  if (nLen < 1) {
    jx9_result_int(pCtx,-1);
  }
  if (nArg == 1) {
    time(&t);
  }
  else {
    if ((apArg[1]->iFlags & 2) != 0) {
      t = jx9_value_to_int64(apArg[1]);
      ptVar6 = localtime(&t);
      if (ptVar6 != (tm *)0x0) goto LAB_0012e4d9;
    }
    time(&t);
  }
LAB_0012e4d9:
  ptVar6 = localtime(&t);
  iVar3 = ptVar6->tm_mon;
  uVar4 = ptVar6->tm_year;
  iVar7 = ptVar6->tm_wday;
  iVar1 = uVar4 + 0x76c;
  cVar2 = *pcVar5;
  switch(cVar2) {
  case 'h':
    iVar7 = ptVar6->tm_hour % 0xc + 1;
  case 'w':
switchD_0012e521_caseD_77:
    iValue = (ulong)iVar7;
    break;
  case 'i':
    iValue = (ulong)ptVar6->tm_min;
    break;
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 'u':
  case 'v':
  case 'x':
switchD_0012e521_caseD_6a:
    jx9_context_throw_error(pCtx,2,"Unknown date format token");
    goto switchD_0012e545_caseD_5a;
  case 'm':
    iValue = (ulong)iVar3;
    break;
  case 's':
    iValue = (ulong)ptVar6->tm_sec;
    break;
  case 't':
    iVar7 = DateFormat::aMonDays[iVar3 % 0xc];
    if ((iVar3 == 1) && (iVar1 % 400 != 0)) {
      if ((uVar4 & 3) != 0) {
        iVar7 = 0x1c;
      }
      if (iVar1 % 100 == 0) {
        iVar7 = 0x1c;
      }
    }
LAB_0012e5f9:
    iValue = (ulong)iVar7;
    break;
  case 'y':
    iVar7 = iVar1 % 100;
    goto switchD_0012e521_caseD_77;
  case 'z':
    iValue = (ulong)ptVar6->tm_yday;
    break;
  default:
    switch(cVar2) {
    case 'U':
      iValue = time((time_t *)0x0);
      break;
    case 'V':
    case 'X':
      goto switchD_0012e521_caseD_6a;
    case 'W':
      iValue = (ulong)aISO8601[iVar7 % 7];
      break;
    case 'Y':
      iValue = (ulong)iVar1;
      break;
    default:
      if (cVar2 == 'H') {
        iValue = (ulong)ptVar6->tm_hour;
        break;
      }
      if (cVar2 == 'I') {
        iValue = (ulong)ptVar6->tm_isdst;
        break;
      }
      if (cVar2 != 'L') {
        iVar7 = ptVar6->tm_mday;
        if (cVar2 == 'd') goto LAB_0012e5f9;
        goto switchD_0012e521_caseD_6a;
      }
      if (iVar1 % 400 == 0) {
        iValue = 1;
        break;
      }
      if (iVar1 % 100 != 0) {
        iValue = (ulong)((uVar4 & 3) == 0);
        break;
      }
    case 'Z':
switchD_0012e545_caseD_5a:
      iValue = 0;
    }
  }
  jx9_result_int64(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_idate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	jx9_int64 iVal = 0;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return -1*/
		jx9_result_int(pCtx, -1);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Perform the requested operation */
	switch(zFormat[0]){
	case 'd':
		/* Day of the month */
		iVal = sTm.tm_mday;
		break;
	case 'h':
		/*	Hour (12 hour format)*/
		iVal = 1 + (sTm.tm_hour % 12);
		break;
	case 'H':
		/* Hour (24 hour format)*/
		iVal = sTm.tm_hour;
		break;
	case 'i':
		/*Minutes*/
		iVal = sTm.tm_min;
		break;
	case 'I':
		/*	returns 1 if DST is activated, 0 otherwise */
#ifdef __WINNT__
#ifdef _MSC_VER
#ifndef _WIN32_WCE
			_get_daylight(&sTm.tm_isdst);
#endif
#endif
#endif
		iVal = sTm.tm_isdst;
		break;
	case 'L':
		/* 	returns 1 for leap year, 0 otherwise */
		iVal = IS_LEAP_YEAR(sTm.tm_year);
		break;
	case 'm':
		/* Month number*/
		iVal = sTm.tm_mon;
		break;
	case 's':
		/*Seconds*/
		iVal = sTm.tm_sec;
		break;
	case 't':{
		/*Days in current month*/
		static const int aMonDays[] = {31, 29, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31 };
		int nDays = aMonDays[sTm.tm_mon % 12 ];
		if( sTm.tm_mon == 1 /* 'February' */ && !IS_LEAP_YEAR(sTm.tm_year) ){
			nDays = 28;
		}
		iVal = nDays;
		break;
			 }
	case 'U':
		/*Seconds since the Unix Epoch*/
		iVal = (jx9_int64)time(0);
		break;
	case 'w':
		/*	Day of the week (0 on Sunday) */
		iVal = sTm.tm_wday;
		break;
	case 'W': {
		/* ISO-8601 week number of year, weeks starting on Monday */
		static const int aISO8601[] = { 7 /* Sunday */, 1 /* Monday */, 2, 3, 4, 5, 6 };
		iVal = aISO8601[sTm.tm_wday % 7 ];
		break;
			  }
	case 'y':
		/* Year (2 digits) */
		iVal = sTm.tm_year % 100;
		break;
	case 'Y':
		/* Year (4 digits) */
		iVal = sTm.tm_year;
		break;
	case 'z':
		/* Day of the year */
		iVal = sTm.tm_yday;
		break;
	case 'Z':
		/*Timezone offset in seconds*/
		iVal = sTm.tm_gmtoff;
		break;
	default:
		/* unknown format, throw a warning */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Unknown date format token");
		break;
	}
	/* Return the time value */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}